

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::parse_mods(CVmPackPos *p,CVmPackType *t)

{
  int iVar1;
  wchar_t wVar2;
  uint uVar3;
  void *pvVar4;
  
LAB_00269311:
  iVar1 = CVmPackPos::more(p);
  if (iVar1 == 0) {
    return;
  }
  wVar2 = CVmPackPos::getch(p);
  if (wVar2 == L'0') {
    pvVar4 = memchr("auwhH",(int)(char)t->type_code,6);
    if (pvVar4 == (void *)0x0) goto switchD_002693d5_caseD_52;
    t->null_term = 1;
  }
  else {
    if (wVar2 == L'>') {
      t->big_endian = 1;
      goto LAB_00269369;
    }
    if (wVar2 == L'<') {
      t->big_endian = 0;
      goto LAB_00269369;
    }
    if (0xfffffff5 < (uint)(wVar2 + L'\xffffffc6')) {
      if (t->count == -2) {
        t->up_to_count = 1;
      }
      uVar3 = p->idx;
      iVar1 = CVmPackPos::parse_int(p);
      t->count = iVar1;
      t->count_as_type = L'\0';
      if (iVar1 < (int)(uint)(t->type_code != L'@')) {
LAB_0026953b:
        err_throw_a(0x6b,1,0,(ulong)uVar3);
      }
      goto LAB_00269311;
    }
    if (wVar2 == L'!') {
      if ((t->type_code == L'\0') ||
         (pvVar4 = memchr("wWhH",(int)(char)t->type_code,5), pvVar4 == (void *)0x0)) {
        t->bang = 1;
      }
      else {
        t->count_in_bytes = 1;
      }
    }
    else if (wVar2 == L'%') {
      t->pct = 1;
    }
    else if (wVar2 == L'*') {
      if (t->count < 0) {
        uVar3 = t->type_code + L'\xffffffc0';
        if ((0x38 < uVar3) || (iVar1 = 0, (0x100000001000001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          iVar1 = -2;
        }
        t->count = iVar1;
        t->count_as_type = L'\0';
      }
      else {
        t->up_to_count = 1;
      }
    }
    else {
      if (wVar2 != L'~') {
        if (wVar2 == L'?') {
          t->qu = 1;
          goto LAB_00269369;
        }
        if (wVar2 != L':') {
          return;
        }
        CVmPackPos::inc(p);
        wVar2 = CVmPackPos::nextch(p);
        switch(wVar2) {
        case L'Q':
        case L'd':
        case L'q':
          t->count_as_type = wVar2;
          t->count = 8;
          break;
        case L'R':
        case L'T':
        case L'V':
        case L'X':
        case L'Y':
        case L'Z':
        case L'[':
        case L'\\':
        case L']':
        case L'^':
        case L'_':
        case L'`':
        case L'e':
        case L'g':
        case L'i':
        case L'j':
        case L'm':
        case L'n':
        case L'o':
        case L'p':
        case L'r':
        case L't':
        case L'v':
switchD_002693d5_caseD_52:
          uVar3 = p->idx;
          goto LAB_0026953b;
        case L'c':
switchD_002693d5_caseD_63:
          t->count_as_type = wVar2;
          t->count = 1;
          break;
        case L'f':
        case L'l':
switchD_002693d5_caseD_66:
          t->count_as_type = wVar2;
          t->count = 4;
          break;
        default:
          if (wVar2 != L'A') {
            if (wVar2 == L'C') goto switchD_002693d5_caseD_63;
            if (wVar2 == L'L') goto switchD_002693d5_caseD_66;
            if (wVar2 != L'H') goto switchD_002693d5_caseD_52;
          }
        case L'S':
        case L'U':
        case L'W':
        case L'a':
        case L'b':
        case L'h':
        case L'k':
        case L's':
        case L'u':
        case L'w':
          t->count_as_type = wVar2;
          t->count = 2;
        }
        goto LAB_00269311;
      }
      t->tilde = 1;
    }
  }
LAB_00269369:
  CVmPackPos::inc(p);
  goto LAB_00269311;
}

Assistant:

void CVmPack::parse_mods(CVmPackPos *p, CVmPackType *t)
{
    /* keep going until we stop finding modifiers */
    while (p->more())
    {
        /* get the next character */
        wchar_t c = p->getch();

        /* check what we have */
        if (c == '<')
        {
            /* little-endian flag - note it and skip it */
            t->big_endian = FALSE;
            p->inc();
        }
        else if (c == '>')
        {
            /* big-endian flag - note it and skip it */
            t->big_endian = TRUE;
            p->inc();
        }
        else if (c == '0')
        {
            /* this can only be used with certain string types */
            if (strchr("auwhH", (char)t->type_code) == 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* null-termination */
            t->null_term = TRUE;
            p->inc();
        }
        else if (is_digit(c))
        {
            /* 
             *   if we already have a '*', the combination of a numeric count
             *   and a '*' makes it an up-to count 
             */
            if (t->count == ITER_STAR)
                t->up_to_count = TRUE;

            /* it's a digit, so this is a simple numeric repeat count */
            int count_idx = p->index();
            t->count = p->parse_int();
            t->count_as_type = 0;

            /* enforce a minimum value of 1 for most types, 0 for @ */
            int minval = (t->type_code == '@' ? 0 : 1);
            if (t->count < minval)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, count_idx);
        }
        else if (c == ':')
        {
            /* repeat count as type - get and remember the type code */
            p->inc();
            c = p->nextch();

            /* validate the type code and get its size */
            switch (c)
            {
            case 'a':
            case 'A':
            case 'b':
            case 'u':
            case 'U':
            case 'h':
            case 'H':
            case 'k':
                t->count_as_type = c;
                t->count = 1;

            case 'w':
            case 'W':
                t->count_as_type = c;
                t->count = 2;
                break;
                
            case 'c':
            case 'C':
                t->count_as_type = c;
                t->count = 1;
                break;
                
            case 's':
            case 'S':
                t->count_as_type = c;
                t->count = 2;
                break;
                
            case 'l':
            case 'L':
            case 'f':
                t->count_as_type = c;
                t->count = 4;
                break;
                
            case 'q':
            case 'Q':
            case 'd':
                t->count_as_type = c;
                t->count = 8;
                break;

            default:
                /* invalid type */
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
            }
        }
        else if (c == '*')
        {
            /* 
             *   if we already have a numeric count, this makes it an up-to
             *   count 
             */
            if (t->count >= 0)
            {
                /* mark it as an up-to count, but leave the count intact */
                t->up_to_count = TRUE;
            }
            else
            {
                /* there's no count yet, so it's an indefinite counter type */
                t->count = star_to_count(t->type_code);
                t->count_as_type = 0;
            }

            /* skip the '*' */
            p->inc();
        }
        else if (c == '!')
        {
            /* 
             *   ! means "count in bytes" for string types wWhH; for other
             *   types just record the !
             */
            if (t->type_code != 0 && strchr("wWhH", (char)t->type_code) != 0)
                t->count_in_bytes = TRUE;
            else
                t->bang = TRUE;
            p->inc();
        }
        else if (c == '~')
        {
            /* note the ~ qualifier */
            t->tilde = TRUE;
            p->inc();
        }
        else if (c == '?')
        {
            /* note the ? qualifier */
            t->qu = TRUE;
            p->inc();
        }
        else if (c == '%')
        {
            /* note the % qualifier */
            t->pct = TRUE;
            p->inc();
        }
        else
        {
            /* it's not a modifier character, so we're done */
            break;
        }
    }
}